

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

int av1_choose_var_based_partitioning
              (AV1_COMP *cpi,TileInfo *tile,ThreadData_conflict *td,MACROBLOCK *x,int mi_row,
              int mi_col)

{
  MV_REFERENCE_FRAME *pMVar1;
  MV_REFERENCE_FRAME *pMVar2;
  _Bool _Var3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  VP128x128 *vt_00;
  long lVar14;
  long in_RCX;
  long lVar15;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  uint uVar16;
  bool bVar17;
  int y8_idx;
  int x8_idx;
  int lvl3_idx_1;
  VP16x16 *vtemp_1;
  int split_index_1;
  int y16_idx;
  int x16_idx;
  int lvl2_idx_1;
  int lvl1_scale_idx_1;
  int y32_idx;
  int x32_idx;
  int lvl1_idx_1;
  int blk64_scale_idx_1;
  int y64_idx;
  int x64_idx;
  int blk64_idx_1;
  int set_avg_64x64;
  int64_t set_threshold;
  _Bool check_noise_lvl;
  int check_max_var;
  int max_min_var_32x32_diff;
  int max_min_var_16X16_diff;
  int is_360p_or_smaller;
  uint64_t frame_sad_thresh;
  int split_index;
  int lvl3_idx;
  VP16x16 *vtemp;
  int lvl2_idx;
  int lvl1_scale_idx;
  int lvl1_idx;
  int blk64_scale_idx;
  int blk64_idx;
  VP128x128 *vt;
  MB_MODE_INFO *mi_1;
  YV12_BUFFER_CONFIG *ref_scaled;
  YV12_BUFFER_CONFIG *ref;
  int src_stride;
  int qindex;
  _Bool is_segment_id_boosted;
  int sbi_row;
  int sbi_col;
  int sb_cols;
  int sb_size_by_mb;
  uint64_t blk_sad;
  int segment_id;
  int64_t thresholds [5];
  MV_REFERENCE_FRAME ref_frame_partition;
  MB_MODE_INFO **mi;
  BLOCK_SIZE bsize;
  uint y_sad_last;
  uint y_sad_alt;
  uint y_sad_g;
  uint y_sad;
  int num_64x64_blocks;
  _Bool is_small_sb;
  _Bool is_key_frame;
  scale_factors sf_no_scale;
  _Bool scaled_ref_last;
  _Bool is_zero_motion;
  NOISE_LEVEL noise_level;
  uint uv_sad [2];
  int dst_stride;
  uint8_t *dst_buf;
  uint8_t *src_buf;
  int minvar_16x16 [4] [4];
  int maxvar_16x16 [4] [4];
  int avg_16x16 [4] [4];
  int max_var_64x64;
  int min_var_64x64;
  int var_64x64;
  int var_32x32;
  int min_var_32x32 [4];
  int max_var_32x32 [4];
  int avg_64x64;
  PART_EVAL_STATUS force_split [85];
  int64_t *vbp_thresholds;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  undefined8 in_stack_fffffffffffffc48;
  undefined8 uVar18;
  scale_factors *in_stack_fffffffffffffc50;
  buf_2d *ref_00;
  MV_REFERENCE_FRAME *pMVar19;
  MV_REFERENCE_FRAME *ref_frame_partition_00;
  MV_REFERENCE_FRAME *memblk;
  segmentation *in_stack_fffffffffffffc58;
  MACROBLOCKD *xd_00;
  int64_t threshold16;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 uVar20;
  int in_stack_fffffffffffffc64;
  uint *in_stack_fffffffffffffc68;
  BLOCK_SIZE bsize_00;
  uint in_stack_fffffffffffffc70;
  undefined4 uVar21;
  undefined4 in_stack_fffffffffffffc74;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  undefined4 in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc84;
  int in_stack_fffffffffffffc88;
  undefined3 uVar22;
  int in_stack_fffffffffffffc8c;
  int in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  int in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  uint in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  uint in_stack_fffffffffffffca8;
  uint y_sad_00;
  char cVar23;
  int in_stack_fffffffffffffcac;
  MACROBLOCKD *in_stack_fffffffffffffcb0;
  AV1_COMP *cpi_00;
  undefined2 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcba;
  undefined1 uVar24;
  int in_stack_fffffffffffffcbc;
  int in_stack_fffffffffffffcc0;
  int local_33c;
  int in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  uint in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce8;
  int local_310;
  int local_300;
  ulong local_2d8;
  int local_2cc;
  undefined8 in_stack_fffffffffffffd38;
  VPartVar *v;
  undefined4 in_stack_fffffffffffffd40;
  undefined2 in_stack_fffffffffffffd44;
  undefined2 uVar25;
  undefined1 in_stack_fffffffffffffd46;
  undefined1 uVar26;
  undefined1 in_stack_fffffffffffffd47;
  undefined1 uVar27;
  uint in_stack_fffffffffffffd48;
  uint in_stack_fffffffffffffd4c;
  uint in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  int iVar28;
  MACROBLOCK *in_stack_fffffffffffffd58;
  AV1_COMP *in_stack_fffffffffffffd60;
  AV1_COMP *in_stack_fffffffffffffd68;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 uVar29;
  int in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  int in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffda0;
  scale_factors *sf_no_scale_00;
  int in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd8;
  bool local_1fd;
  byte local_1ea;
  NOISE_LEVEL local_1e8;
  undefined1 local_1e4 [8];
  undefined4 local_1dc;
  undefined8 local_1d8;
  int64_t local_1d0;
  int local_1c8 [16];
  int local_188 [16];
  int local_148 [16];
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int aiStack_f8 [4];
  int aiStack_e8 [7];
  int local_cc;
  char local_c8 [88];
  long *local_70;
  long local_68;
  AV1_COMMON *local_60;
  int local_58;
  int local_54;
  long local_50;
  long local_48;
  long local_40;
  long *local_38;
  
  uVar25 = (undefined2)((ulong)in_stack_fffffffffffffd38 >> 0x30);
  local_60 = (AV1_COMMON *)(in_RDI + 0x77f0);
  local_68 = in_RCX + 0x1a0;
  local_70 = in_RDI + 0x10267;
  local_104 = 0x7fffffff;
  local_108 = 0;
  local_1e8 = kLow;
  local_1ea = 0;
  local_58 = in_R9D;
  local_54 = in_R8D;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  local_38 = in_RDI;
  av1_setup_scale_factors_for_frame
            (in_stack_fffffffffffffc50,(int)((ulong)in_stack_fffffffffffffc48 >> 0x20),
             (int)in_stack_fffffffffffffc48,0,0x34355c);
  uVar20 = (undefined4)((ulong)in_stack_fffffffffffffc48 >> 0x20);
  iVar5 = frame_is_intra_only(local_60);
  local_1fd = true;
  if ((iVar5 == 0) &&
     (in_stack_fffffffffffffcba = false, local_1fd = (bool)in_stack_fffffffffffffcba,
     *(int *)(*local_38 + 0xc750) != 0)) {
    in_stack_fffffffffffffcba =
         *(int *)(local_38[0x13a91] + (long)*(int *)((long)local_38 + 0x9d334) * 0x3380 + 0x3378) !=
         0;
    local_1fd = (bool)in_stack_fffffffffffffcba;
  }
  bVar17 = local_60->seq_params->sb_size == BLOCK_64X64;
  iVar5 = 4;
  if (bVar17) {
    iVar5 = 1;
  }
  if ((((int)local_38[0xc1bd] == 0) || ((int)local_38[0xc0f6] == 0)) ||
     (*(int *)(*local_38 + 0x14dc4) == 0)) {
    memblk = (MV_REFERENCE_FRAME *)*local_70;
    pMVar1 = (MV_REFERENCE_FRAME *)local_70[1];
    pMVar2 = (MV_REFERENCE_FRAME *)local_70[2];
    ref_frame_partition_00 = (MV_REFERENCE_FRAME *)local_70[3];
    sf_no_scale_00 = (scale_factors *)local_70[4];
    uVar6 = (uint)((byte)*(undefined2 *)(**(long **)(local_68 + 0x1eb8) + 0xa7) & 7);
    iVar28 = 0;
    if ((local_38[0x13ac9] != 0) && ((int)local_38[0x13a66] == (int)local_38[0x13a67] + -1)) {
      if (local_60->seq_params->sb_size == BLOCK_128X128) {
        in_stack_fffffffffffffcac = local_60->seq_params->mib_size >> 1;
      }
      else {
        in_stack_fffffffffffffcac = local_60->seq_params->mib_size;
      }
      in_stack_fffffffffffffd90 =
           ((local_60->mi_params).mi_cols + in_stack_fffffffffffffcac + -1) /
           in_stack_fffffffffffffcac;
      in_stack_fffffffffffffd8c = local_58 / in_stack_fffffffffffffcac;
      in_stack_fffffffffffffd88 = local_54 / in_stack_fffffffffffffcac;
      iVar28 = (int)*(undefined8 *)
                     (local_38[0x13ac9] +
                     (long)(in_stack_fffffffffffffd8c +
                           in_stack_fffffffffffffd88 * in_stack_fffffffffffffd90) * 8);
      in_stack_fffffffffffffd94 = in_stack_fffffffffffffcac;
    }
    y_sad_00 = in_stack_fffffffffffffca8 & 0xffffff;
    uVar24 = local_1fd;
    if (((char)local_38[0x8480] == '\x03') &&
       (y_sad_00 = in_stack_fffffffffffffca8 & 0xffffff, (local_60->seg).enabled != '\0')) {
      iVar7 = cyclic_refresh_segment_id_boosted(uVar6);
      y_sad_00 = CONCAT13(iVar7 != 0,(int3)y_sad_00);
    }
    cVar23 = (char)(y_sad_00 >> 0x18);
    uVar29 = CONCAT13(cVar23,(int3)in_stack_fffffffffffffd84);
    if (cVar23 == '\0') {
      iVar7 = (local_60->quant_params).base_qindex;
    }
    else {
      iVar7 = av1_get_qindex(in_stack_fffffffffffffc58,
                             (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                             (int)in_stack_fffffffffffffc50);
    }
    uVar18 = CONCAT44(uVar20,*(undefined4 *)(local_50 + 0x15d64));
    ref_00 = (buf_2d *)
             CONCAT44((int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                      (uint)((byte)((uint)uVar29 >> 0x18) & 1));
    xd_00 = (MACROBLOCKD *)
            CONCAT44((int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                     *(undefined4 *)(local_50 + 0x15d68));
    iVar10 = iVar7;
    set_vbp_thresholds((AV1_COMP *)CONCAT44(iVar7,in_stack_fffffffffffffca0),
                       (int64_t *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                       CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                       in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88,in_stack_fffffffffffffc84
                       ,(int)in_stack_fffffffffffffcb0,
                       SUB41((uint)in_stack_fffffffffffffc80 >> 0x18,0),in_stack_fffffffffffffcc0);
    local_1d0 = *(int64_t *)(local_50 + 0x30);
    uVar20 = *(undefined4 *)(local_50 + 0x48);
    local_c8[0] = '\0';
    memset((void *)(local_50 + 0x18ba0),0,0x69);
    iVar8 = frame_is_intra_only(local_60);
    if (iVar8 == 0) {
      in_stack_fffffffffffffd70 =
           get_ref_frame_yv12_buf
                     ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                      (MV_REFERENCE_FRAME)((ulong)xd_00 >> 0x38));
      if (in_stack_fffffffffffffd70 == (YV12_BUFFER_CONFIG *)0x0) {
        local_1fd = true;
      }
      else if (((in_stack_fffffffffffffd70->field_3).field_0.y_crop_height != local_60->height) ||
              ((in_stack_fffffffffffffd70->field_2).field_0.y_crop_width != local_60->width)) {
        local_1ea = 1;
        in_stack_fffffffffffffd68 =
             (AV1_COMP *)
             av1_get_scaled_ref_frame
                       ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                        (int)((ulong)xd_00 >> 0x20));
        if (in_stack_fffffffffffffd68 == (AV1_COMP *)0x0) {
          local_1fd = true;
        }
      }
    }
    *(undefined4 *)(local_50 + 0x25640) = 0xffffffff;
    if (((int)local_38[0xc196] != 0) && (2 < *(uint *)(local_50 + 0x15d60))) {
      uVar9 = av1_get_perpixel_variance_facade
                        ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                         xd_00,ref_00,(BLOCK_SIZE)((ulong)uVar18 >> 0x38),(int)uVar18);
      *(uint *)(local_50 + 0x25640) = uVar9;
    }
    if (local_1fd == false) {
      in_stack_fffffffffffffc68 =
           (uint *)CONCAT44((int)((ulong)in_stack_fffffffffffffc68 >> 0x20),(uint)bVar17);
      in_stack_fffffffffffffc70 = (uint)local_1ea;
      setup_planes((AV1_COMP *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   (uint *)CONCAT44(uVar29,iVar10),
                   (uint *)CONCAT44(uVar20,in_stack_fffffffffffffd78),
                   (uint *)in_stack_fffffffffffffd70,(uint *)in_stack_fffffffffffffd68,
                   ref_frame_partition_00,sf_no_scale_00,in_stack_fffffffffffffdd0,
                   in_stack_fffffffffffffdd8,SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0),
                   SUB81((ulong)in_stack_fffffffffffffd60 >> 0x30,0));
      in_stack_fffffffffffffd60 = (AV1_COMP *)**(long **)(local_68 + 0x1eb8);
      if (*(int *)&in_stack_fffffffffffffd60->field_0x8 == 0) {
        local_1d8 = *(undefined8 *)(local_68 + 0x40);
        local_1dc = *(undefined4 *)(local_68 + 0x58);
      }
      else {
        local_1d8 = *(undefined8 *)(local_68 + 0x20);
        local_1dc = *(undefined4 *)(local_68 + 0x38);
      }
    }
    else {
      local_1d8 = 0;
      local_1dc = 0;
    }
    memset(local_1e4,0,8);
    chroma_check(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                 (BLOCK_SIZE)((uint)in_stack_fffffffffffffd54 >> 0x18),in_stack_fffffffffffffd50,
                 in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48,
                 (_Bool)in_stack_fffffffffffffd47,(_Bool)in_stack_fffffffffffffd46,
                 (uint *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    *(undefined4 *)(local_50 + 0x15240) = 0;
    vt_00 = (VP128x128 *)aom_malloc(0x343d74);
    if (vt_00 == (VP128x128 *)0x0) {
      aom_internal_error(*(aom_internal_error_info **)(local_68 + 0x29f0),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate vt");
    }
    vt_00->split = *(VP64x64 **)(local_48 + 0x25d78);
    if ((((local_1fd != false) || ((int)local_38[0xc1b6] == 0)) || ((int)local_38[0xc0f4] < 0x1f))
       || (((uVar6 != 0 || (*(int *)(**(long **)(local_68 + 0x1eb8) + 8) != 0)) ||
           (_Var3 = set_force_zeromv_skip_for_sb
                              ((AV1_COMP *)
                               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                               (MACROBLOCK *)
                               CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                               (TileInfo *)
                               CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                               (VP128x128 *)
                               CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                               in_stack_fffffffffffffc68,in_stack_fffffffffffffc64,
                               in_stack_fffffffffffffca0,y_sad_00,
                               (BLOCK_SIZE)in_stack_fffffffffffffcb0), !_Var3)))) {
      if ((int)local_38[0x13a9c] != 0) {
        local_1e8 = av1_noise_estimate_extract_level((NOISE_ESTIMATE *)(local_38 + 0x13a9c));
      }
      pMVar19 = &stack0xfffffffffffffda8;
      uVar16 = (uint)local_1fd;
      uVar9 = (uint)bVar17;
      threshold16 = local_1d0;
      uVar18 = local_1d8;
      uVar21 = local_1dc;
      fill_variance_tree_leaves
                (in_stack_fffffffffffffd68,(MACROBLOCK *)in_stack_fffffffffffffd60,vt_00,
                 (PART_EVAL_STATUS *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 (int (*) [4])CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                 (int (*) [4])
                 CONCAT17(in_stack_fffffffffffffd47,
                          CONCAT16(in_stack_fffffffffffffd46,
                                   CONCAT24(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40))),
                 (int (*) [4])CONCAT44(uVar29,iVar10),
                 (int64_t *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),iVar28,
                 (uint8_t *)CONCAT44(uVar6,in_stack_fffffffffffffda0),(int)memblk,
                 SUB21((ushort)uVar25 >> 8,0),SUB21(uVar25,0));
      local_cc = 0;
      for (iVar28 = 0; iVar28 < iVar5; iVar28 = iVar28 + 1) {
        aiStack_e8[iVar28] = 0;
        aiStack_f8[iVar28] = 0x7fffffff;
        iVar10 = iVar28 << 2;
        for (iVar8 = 0; iVar8 < 4; iVar8 = iVar8 + 1) {
          iVar11 = (iVar10 + iVar8) * 4;
          uVar25 = 0;
          uVar26 = 0;
          uVar27 = 0;
          while (CONCAT13(uVar27,CONCAT12(uVar26,uVar25)) < 4) {
            if (local_1fd != false) {
              v = (VPartVar *)
                  (vt_00->split[iVar28].split[iVar8].split +
                  CONCAT13(uVar27,CONCAT12(uVar26,uVar25)));
              for (local_2cc = 0; bsize_00 = (BLOCK_SIZE)((ulong)uVar18 >> 0x38), local_2cc < 4;
                  local_2cc = local_2cc + 1) {
                fill_variance_tree((void *)CONCAT44(in_stack_fffffffffffffc74,uVar21),bsize_00);
              }
              fill_variance_tree((void *)CONCAT44(in_stack_fffffffffffffc74,uVar21),bsize_00);
              get_variance(v);
              if ((long)ref_frame_partition_00 < (long)v->variance) {
                iVar12 = iVar11 + 0x15;
                iVar13 = CONCAT13(uVar27,CONCAT12(uVar26,uVar25));
                if ((*(byte *)((long)local_38 + 0x60dc4) & 1) == 0) {
                  in_stack_fffffffffffffca0 = 1;
                }
                else {
                  bVar4 = get_part_eval_based_on_sub_blk_var
                                    ((VP16x16 *)CONCAT44(in_stack_fffffffffffffc64,uVar20),
                                     threshold16);
                  in_stack_fffffffffffffca0 = (uint)bVar4;
                }
                local_c8[iVar12 + iVar13] = (char)in_stack_fffffffffffffca0;
                local_c8[iVar10 + 5 + iVar8] = '\x01';
                local_c8[iVar28 + 1] = '\x01';
                local_c8[0] = '\x01';
              }
            }
            iVar13 = CONCAT13(uVar27,CONCAT12(uVar26,uVar25)) + 1;
            uVar25 = (undefined2)iVar13;
            uVar26 = (undefined1)((uint)iVar13 >> 0x10);
            uVar27 = (undefined1)((uint)iVar13 >> 0x18);
          }
          fill_variance_tree((void *)CONCAT44(in_stack_fffffffffffffc74,uVar21),
                             (BLOCK_SIZE)((ulong)uVar18 >> 0x38));
          local_2d8 = 20000;
          uVar6 = (uint)(local_60->width * local_60->height < 0x38401);
          if ((2 < *(int *)((long)local_38 + 0x9d33c)) && (*(int *)((long)local_38 + 0x9d334) == 0))
          {
            local_2d8 = 40000;
          }
          if (local_c8[iVar10 + 5 + iVar8] == '\0') {
            get_variance((VPartVar *)(vt_00->split[iVar28].split + iVar8));
            local_fc = vt_00->split[iVar28].split[iVar8].part_variances.none.variance;
            in_stack_fffffffffffffc9c = local_fc;
            if (local_fc <= aiStack_e8[iVar28]) {
              in_stack_fffffffffffffc9c = aiStack_e8[iVar28];
            }
            aiStack_e8[iVar28] = in_stack_fffffffffffffc9c;
            in_stack_fffffffffffffc98 = local_fc;
            if (aiStack_f8[iVar28] <= local_fc) {
              in_stack_fffffffffffffc98 = aiStack_f8[iVar28];
            }
            aiStack_f8[iVar28] = in_stack_fffffffffffffc98;
            if (((long)pMVar2 < (long)local_fc) ||
               (((local_1fd == false && ((long)pMVar2 >> 1 < (long)local_fc)) &&
                (local_148[(long)iVar28 * 4 + (long)iVar8] >> 1 < local_fc)))) {
              local_c8[iVar10 + 5 + iVar8] = '\x01';
              local_c8[iVar28 + 1] = '\x01';
              local_c8[0] = '\x01';
            }
            else if (((local_1fd == false) && (uVar6 != 0)) &&
                    ((((long)pMVar2 >> 1 <
                       (long)(local_188[(long)iVar28 * 4 + (long)iVar8] -
                             local_1c8[(long)iVar28 * 4 + (long)iVar8]) &&
                      ((long)pMVar2 < (long)local_188[(long)iVar28 * 4 + (long)iVar8])) ||
                     ((((*(int *)((long)local_38 + 0x60cfc) != 0 &&
                        (2 < *(uint *)(local_50 + 0x15d60))) &&
                       ((ulong)local_38[0xc0f9] < local_2d8)) &&
                      (((long)pMVar2 >> 4 < (long)local_188[(long)iVar28 * 4 + (long)iVar8] &&
                       (local_1c8[(long)iVar28 * 4 + (long)iVar8] * 4 <
                        local_188[(long)iVar28 * 4 + (long)iVar8])))))))) {
              local_c8[iVar10 + 5 + iVar8] = '\x01';
              local_c8[iVar28 + 1] = '\x01';
              local_c8[0] = '\x01';
            }
          }
        }
        if (local_c8[iVar28 + 1] == '\0') {
          fill_variance_tree((void *)CONCAT44(in_stack_fffffffffffffc74,uVar21),
                             (BLOCK_SIZE)((ulong)uVar18 >> 0x38));
          get_variance((VPartVar *)(vt_00->split + iVar28));
          local_100 = vt_00->split[iVar28].part_variances.none.variance;
          in_stack_fffffffffffffc94 = local_108;
          if (local_108 < local_100) {
            in_stack_fffffffffffffc94 = local_100;
          }
          local_108 = in_stack_fffffffffffffc94;
          in_stack_fffffffffffffc90 = local_104;
          if (local_100 < local_104) {
            in_stack_fffffffffffffc90 = local_100;
          }
          local_104 = in_stack_fffffffffffffc90;
          uVar22 = (undefined3)in_stack_fffffffffffffc8c;
          in_stack_fffffffffffffc8c = CONCAT13(1,uVar22);
          if ((local_1e8 < kMedium) &&
             (in_stack_fffffffffffffc8c = CONCAT13(1,uVar22), *(int *)(*local_38 + 0xc750) == 0)) {
            in_stack_fffffffffffffc8c = CONCAT13(*(int *)((long)local_38 + 0x60cfc) != 0,uVar22);
          }
          if ((((local_1fd == false) &&
               (((long)pMVar1 >> 3) * 3 < (long)(aiStack_e8[iVar28] - aiStack_f8[iVar28]))) &&
              ((long)pMVar1 >> 1 < (long)aiStack_e8[iVar28])) &&
             ((char)((uint)in_stack_fffffffffffffc8c >> 0x18) != '\0')) {
            local_c8[iVar28 + 1] = '\x01';
            local_c8[0] = '\x01';
          }
          local_cc = local_100 + local_cc;
        }
        if (bVar17) {
          local_c8[0] = '\x01';
        }
      }
      if (local_c8[0] == '\0') {
        fill_variance_tree((void *)CONCAT44(in_stack_fffffffffffffc74,uVar21),
                           (BLOCK_SIZE)((ulong)uVar18 >> 0x38));
        get_variance((VPartVar *)vt_00);
        if ((local_1fd == false) && (local_cc * 9 >> 5 < (vt_00->part_variances).none.variance)) {
          local_c8[0] = '\x01';
        }
        if (((local_1fd == false) &&
            (lVar14 = (long)(local_108 - local_104), lVar15 = ((long)memblk >> 3) * 3,
            lVar14 != lVar15 && SBORROW8(lVar14,lVar15) == lVar14 + ((long)memblk >> 3) * -3 < 0))
           && ((long)memblk >> 1 < (long)local_108)) {
          local_c8[0] = '\x01';
        }
      }
      if (((*(int *)(local_40 + 0xc) < local_58 + 0x20) ||
          (*(int *)(local_40 + 4) < local_54 + 0x20)) ||
         (iVar28 = set_vt_partitioning((AV1_COMP *)
                                       CONCAT44(in_stack_fffffffffffffcbc,
                                                CONCAT13(uVar24,CONCAT12(in_stack_fffffffffffffcba,
                                                                         in_stack_fffffffffffffcb8))
                                               ),in_stack_fffffffffffffcb0,
                                       (TileInfo *)CONCAT44(in_stack_fffffffffffffcac,y_sad_00),
                                       (void *)CONCAT44(iVar7,in_stack_fffffffffffffca0),
                                       (BLOCK_SIZE)((uint)in_stack_fffffffffffffc9c >> 0x18),
                                       in_stack_fffffffffffffc98,in_stack_fffffffffffffcd0,
                                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                                       ,(BLOCK_SIZE)in_stack_fffffffffffffce0,
                                       (PART_EVAL_STATUS)in_stack_fffffffffffffce8),
         pMVar19 = memblk, iVar28 == 0)) {
        memblk = pMVar19;
        for (local_300 = 0; local_300 < iVar5; local_300 = local_300 + 1) {
          memblk = pMVar1;
          iVar28 = set_vt_partitioning((AV1_COMP *)
                                       CONCAT44(in_stack_fffffffffffffcbc,
                                                CONCAT13(uVar24,CONCAT12(in_stack_fffffffffffffcba,
                                                                         in_stack_fffffffffffffcb8))
                                               ),in_stack_fffffffffffffcb0,
                                       (TileInfo *)CONCAT44(in_stack_fffffffffffffcac,y_sad_00),
                                       (void *)CONCAT44(iVar7,in_stack_fffffffffffffca0),
                                       (BLOCK_SIZE)((uint)in_stack_fffffffffffffc9c >> 0x18),
                                       in_stack_fffffffffffffc98,in_stack_fffffffffffffcd0,
                                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                                       ,(BLOCK_SIZE)in_stack_fffffffffffffce0,
                                       (PART_EVAL_STATUS)in_stack_fffffffffffffce8);
          if (iVar28 == 0) {
            for (local_310 = 0; local_310 < 4; local_310 = local_310 + 1) {
              in_stack_fffffffffffffce8 = (local_310 >> 1) << 3;
              memblk = pMVar2;
              iVar28 = set_vt_partitioning((AV1_COMP *)
                                           CONCAT44(in_stack_fffffffffffffcbc,
                                                    CONCAT13(uVar24,CONCAT12(
                                                  in_stack_fffffffffffffcba,
                                                  in_stack_fffffffffffffcb8))),
                                           in_stack_fffffffffffffcb0,
                                           (TileInfo *)CONCAT44(in_stack_fffffffffffffcac,y_sad_00),
                                           (void *)CONCAT44(iVar7,in_stack_fffffffffffffca0),
                                           (BLOCK_SIZE)((uint)in_stack_fffffffffffffc9c >> 0x18),
                                           in_stack_fffffffffffffc98,in_stack_fffffffffffffcd0,
                                           CONCAT44(in_stack_fffffffffffffcdc,
                                                    in_stack_fffffffffffffcd8),
                                           (BLOCK_SIZE)in_stack_fffffffffffffce0,
                                           (PART_EVAL_STATUS)in_stack_fffffffffffffce8);
              if (iVar28 == 0) {
                for (in_stack_fffffffffffffce0 = 0; (int)in_stack_fffffffffffffce0 < 4;
                    in_stack_fffffffffffffce0 = in_stack_fffffffffffffce0 + 1) {
                  in_stack_fffffffffffffcdc = (in_stack_fffffffffffffce0 & 1) * 4;
                  in_stack_fffffffffffffcd8 = ((int)in_stack_fffffffffffffce0 >> 1) << 2;
                  pMVar19 = ref_frame_partition_00;
                  iVar28 = set_vt_partitioning((AV1_COMP *)
                                               CONCAT44(in_stack_fffffffffffffcbc,
                                                        CONCAT13(uVar24,CONCAT12(
                                                  in_stack_fffffffffffffcba,
                                                  in_stack_fffffffffffffcb8))),
                                               in_stack_fffffffffffffcb0,
                                               (TileInfo *)
                                               CONCAT44(in_stack_fffffffffffffcac,y_sad_00),
                                               (void *)CONCAT44(iVar7,in_stack_fffffffffffffca0),
                                               (BLOCK_SIZE)((uint)in_stack_fffffffffffffc9c >> 0x18)
                                               ,in_stack_fffffffffffffc98,in_stack_fffffffffffffcd0,
                                               CONCAT44(in_stack_fffffffffffffcdc,
                                                        in_stack_fffffffffffffcd8),
                                               (BLOCK_SIZE)in_stack_fffffffffffffce0,
                                               (PART_EVAL_STATUS)in_stack_fffffffffffffce8);
                  if (iVar28 == 0) {
                    for (local_33c = 0; local_33c < 4; local_33c = local_33c + 1) {
                      in_stack_fffffffffffffcbc = (local_33c >> 1) << 1;
                      set_block_size((AV1_COMP *)CONCAT44(in_stack_fffffffffffffc74,uVar21),
                                     (int)((ulong)uVar18 >> 0x20),(int)uVar18,
                                     (BLOCK_SIZE)((uint)in_stack_fffffffffffffc64 >> 0x18));
                    }
                  }
                  memblk = ref_frame_partition_00;
                  ref_frame_partition_00 = pMVar19;
                }
              }
            }
          }
        }
      }
      if (*(int *)((long)local_38 + 0x60ccc) != 0) {
        memblk = (MV_REFERENCE_FRAME *)CONCAT44((int)((ulong)memblk >> 0x20),local_54);
        set_low_temp_var_flag
                  ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                   (PartitionSearchInfo *)
                   CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                   (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffc84,uVar9),
                   (VP128x128 *)CONCAT44(in_stack_fffffffffffffc7c,uVar16),
                   (int64_t *)CONCAT44(in_stack_fffffffffffffc74,uVar21),
                   (MV_REFERENCE_FRAME)((ulong)uVar18 >> 0x38),in_stack_fffffffffffffca0,y_sad_00,
                   SUB81((ulong)uVar18 >> 0x30,0));
      }
      aom_free(memblk);
    }
  }
  else {
    cpi_00 = (AV1_COMP *)(local_60->mi_params).mi_grid_base;
    get_mi_grid_idx(&local_60->mi_params,local_54,local_58);
    av1_set_fixed_partitioning
              (cpi_00,(TileInfo *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
               (MB_MODE_INFO **)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
               in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98,
               (BLOCK_SIZE)((uint)in_stack_fffffffffffffc94 >> 0x18));
    *(undefined4 *)(local_50 + 0x15240) = 1;
  }
  return 0;
}

Assistant:

int av1_choose_var_based_partitioning(AV1_COMP *cpi, const TileInfo *const tile,
                                      ThreadData *td, MACROBLOCK *x, int mi_row,
                                      int mi_col) {
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, choose_var_based_partitioning_time);
#endif
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  const int64_t *const vbp_thresholds = cpi->vbp_info.thresholds;
  PART_EVAL_STATUS force_split[85];
  int avg_64x64;
  int max_var_32x32[4];
  int min_var_32x32[4];
  int var_32x32;
  int var_64x64;
  int min_var_64x64 = INT_MAX;
  int max_var_64x64 = 0;
  int avg_16x16[4][4];
  int maxvar_16x16[4][4];
  int minvar_16x16[4][4];
  const uint8_t *src_buf;
  const uint8_t *dst_buf;
  int dst_stride;
  unsigned int uv_sad[MAX_MB_PLANE - 1];
  NOISE_LEVEL noise_level = kLow;
  bool is_zero_motion = true;
  bool scaled_ref_last = false;
  struct scale_factors sf_no_scale;
  av1_setup_scale_factors_for_frame(&sf_no_scale, cm->width, cm->height,
                                    cm->width, cm->height);

  bool is_key_frame =
      (frame_is_intra_only(cm) ||
       (cpi->ppi->use_svc &&
        cpi->svc.layer_context[cpi->svc.temporal_layer_id].is_key_frame));

  assert(cm->seq_params->sb_size == BLOCK_64X64 ||
         cm->seq_params->sb_size == BLOCK_128X128);
  const bool is_small_sb = (cm->seq_params->sb_size == BLOCK_64X64);
  const int num_64x64_blocks = is_small_sb ? 1 : 4;

  unsigned int y_sad = UINT_MAX;
  unsigned int y_sad_g = UINT_MAX;
  unsigned int y_sad_alt = UINT_MAX;
  unsigned int y_sad_last = UINT_MAX;
  BLOCK_SIZE bsize = is_small_sb ? BLOCK_64X64 : BLOCK_128X128;

  // Force skip encoding for all superblocks on slide change for
  // non_reference_frames.
  if (cpi->sf.rt_sf.skip_encoding_non_reference_slide_change &&
      cpi->rc.high_source_sad && cpi->ppi->rtc_ref.non_reference_frame) {
    MB_MODE_INFO **mi = cm->mi_params.mi_grid_base +
                        get_mi_grid_idx(&cm->mi_params, mi_row, mi_col);
    av1_set_fixed_partitioning(cpi, tile, mi, mi_row, mi_col, bsize);
    x->force_zeromv_skip_for_sb = 1;
    return 0;
  }

  // Ref frame used in partitioning.
  MV_REFERENCE_FRAME ref_frame_partition = LAST_FRAME;

  int64_t thresholds[5] = { vbp_thresholds[0], vbp_thresholds[1],
                            vbp_thresholds[2], vbp_thresholds[3],
                            vbp_thresholds[4] };

  const int segment_id = xd->mi[0]->segment_id;
  uint64_t blk_sad = 0;
  if (cpi->src_sad_blk_64x64 != NULL &&
      cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1) {
    const int sb_size_by_mb = (cm->seq_params->sb_size == BLOCK_128X128)
                                  ? (cm->seq_params->mib_size >> 1)
                                  : cm->seq_params->mib_size;
    const int sb_cols =
        (cm->mi_params.mi_cols + sb_size_by_mb - 1) / sb_size_by_mb;
    const int sbi_col = mi_col / sb_size_by_mb;
    const int sbi_row = mi_row / sb_size_by_mb;
    blk_sad = cpi->src_sad_blk_64x64[sbi_col + sbi_row * sb_cols];
  }

  const bool is_segment_id_boosted =
      cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ && cm->seg.enabled &&
      cyclic_refresh_segment_id_boosted(segment_id);
  const int qindex =
      is_segment_id_boosted
          ? av1_get_qindex(&cm->seg, segment_id, cm->quant_params.base_qindex)
          : cm->quant_params.base_qindex;
  set_vbp_thresholds(
      cpi, thresholds, blk_sad, qindex, x->content_state_sb.low_sumdiff,
      x->content_state_sb.source_sad_nonrd, x->content_state_sb.source_sad_rd,
      is_segment_id_boosted, x->content_state_sb.lighting_change);

  src_buf = x->plane[AOM_PLANE_Y].src.buf;
  int src_stride = x->plane[AOM_PLANE_Y].src.stride;

  // Index for force_split: 0 for 64x64, 1-4 for 32x32 blocks,
  // 5-20 for the 16x16 blocks.
  force_split[0] = PART_EVAL_ALL;
  memset(x->part_search_info.variance_low, 0,
         sizeof(x->part_search_info.variance_low));

  // Check if LAST frame is NULL, and if so, treat this frame
  // as a key frame, for the purpose of the superblock partitioning.
  // LAST == NULL can happen in cases where enhancement spatial layers are
  // enabled dyanmically and the only reference is the spatial(GOLDEN).
  // If LAST frame has a different resolution: set the scaled_ref_last flag
  // and check if ref_scaled is NULL.
  if (!frame_is_intra_only(cm)) {
    const YV12_BUFFER_CONFIG *ref = get_ref_frame_yv12_buf(cm, LAST_FRAME);
    if (ref == NULL) {
      is_key_frame = true;
    } else if (ref->y_crop_height != cm->height ||
               ref->y_crop_width != cm->width) {
      scaled_ref_last = true;
      const YV12_BUFFER_CONFIG *ref_scaled =
          av1_get_scaled_ref_frame(cpi, LAST_FRAME);
      if (ref_scaled == NULL) is_key_frame = true;
    }
  }

  x->source_variance = UINT_MAX;
  // For nord_pickmode: compute source_variance, only for superblocks with
  // some motion for now. This input can then be used to bias the partitioning
  // or the chroma_check.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode &&
      x->content_state_sb.source_sad_nonrd > kLowSad)
    x->source_variance = av1_get_perpixel_variance_facade(
        cpi, xd, &x->plane[0].src, cm->seq_params->sb_size, AOM_PLANE_Y);

  if (!is_key_frame) {
    setup_planes(cpi, x, &y_sad, &y_sad_g, &y_sad_alt, &y_sad_last,
                 &ref_frame_partition, &sf_no_scale, mi_row, mi_col,
                 is_small_sb, scaled_ref_last);

    MB_MODE_INFO *mi = xd->mi[0];
    // Use reference SB directly for zero mv.
    if (mi->mv[0].as_int != 0) {
      dst_buf = xd->plane[AOM_PLANE_Y].dst.buf;
      dst_stride = xd->plane[AOM_PLANE_Y].dst.stride;
      is_zero_motion = false;
    } else {
      dst_buf = xd->plane[AOM_PLANE_Y].pre[0].buf;
      dst_stride = xd->plane[AOM_PLANE_Y].pre[0].stride;
    }
  } else {
    dst_buf = NULL;
    dst_stride = 0;
  }

  // check and set the color sensitivity of sb.
  av1_zero(uv_sad);
  chroma_check(cpi, x, bsize, y_sad_last, y_sad_g, y_sad_alt, is_key_frame,
               is_zero_motion, uv_sad);

  x->force_zeromv_skip_for_sb = 0;

  VP128x128 *vt;
  AOM_CHECK_MEM_ERROR(xd->error_info, vt, aom_malloc(sizeof(*vt)));
  vt->split = td->vt64x64;

  // If the superblock is completely static (zero source sad) and
  // the y_sad (relative to LAST ref) is very small, take the sb_size partition
  // and exit, and force zeromv_last skip mode for nonrd_pickmode.
  // Only do this on the base segment (so the QP-boosted segment, if applied,
  // can still continue cleaning/ramping up the quality).
  // Condition on color uv_sad is also added.
  if (!is_key_frame && cpi->sf.rt_sf.part_early_exit_zeromv &&
      cpi->rc.frames_since_key > 30 && segment_id == CR_SEGMENT_ID_BASE &&
      ref_frame_partition == LAST_FRAME && xd->mi[0]->mv[0].as_int == 0) {
    // Exit here, if zero mv skip flag is set at SB level.
    if (set_force_zeromv_skip_for_sb(cpi, x, tile, vt, uv_sad, mi_row, mi_col,
                                     y_sad, bsize))
      return 0;
  }

  if (cpi->noise_estimate.enabled)
    noise_level = av1_noise_estimate_extract_level(&cpi->noise_estimate);

  // Fill in the entire tree of 8x8 (for inter frames) or 4x4 (for key frames)
  // variances for splits.
  fill_variance_tree_leaves(cpi, x, vt, force_split, avg_16x16, maxvar_16x16,
                            minvar_16x16, thresholds, src_buf, src_stride,
                            dst_buf, dst_stride, is_key_frame, is_small_sb);

  avg_64x64 = 0;
  for (int blk64_idx = 0; blk64_idx < num_64x64_blocks; ++blk64_idx) {
    max_var_32x32[blk64_idx] = 0;
    min_var_32x32[blk64_idx] = INT_MAX;
    const int blk64_scale_idx = blk64_idx << 2;
    for (int lvl1_idx = 0; lvl1_idx < 4; lvl1_idx++) {
      const int lvl1_scale_idx = (blk64_scale_idx + lvl1_idx) << 2;
      for (int lvl2_idx = 0; lvl2_idx < 4; lvl2_idx++) {
        if (!is_key_frame) continue;
        VP16x16 *vtemp = &vt->split[blk64_idx].split[lvl1_idx].split[lvl2_idx];
        for (int lvl3_idx = 0; lvl3_idx < 4; lvl3_idx++)
          fill_variance_tree(&vtemp->split[lvl3_idx], BLOCK_8X8);
        fill_variance_tree(vtemp, BLOCK_16X16);
        // If variance of this 16x16 block is above the threshold, force block
        // to split. This also forces a split on the upper levels.
        get_variance(&vtemp->part_variances.none);
        if (vtemp->part_variances.none.variance > thresholds[3]) {
          const int split_index = 21 + lvl1_scale_idx + lvl2_idx;
          force_split[split_index] =
              cpi->sf.rt_sf.vbp_prune_16x16_split_using_min_max_sub_blk_var
                  ? get_part_eval_based_on_sub_blk_var(vtemp, thresholds[3])
                  : PART_EVAL_ONLY_SPLIT;
          force_split[5 + blk64_scale_idx + lvl1_idx] = PART_EVAL_ONLY_SPLIT;
          force_split[blk64_idx + 1] = PART_EVAL_ONLY_SPLIT;
          force_split[0] = PART_EVAL_ONLY_SPLIT;
        }
      }
      fill_variance_tree(&vt->split[blk64_idx].split[lvl1_idx], BLOCK_32X32);
      // If variance of this 32x32 block is above the threshold, or if its above
      // (some threshold of) the average variance over the sub-16x16 blocks,
      // then force this block to split. This also forces a split on the upper
      // (64x64) level.
      uint64_t frame_sad_thresh = 20000;
      const int is_360p_or_smaller = cm->width * cm->height <= RESOLUTION_360P;
      if (cpi->svc.number_temporal_layers > 2 &&
          cpi->svc.temporal_layer_id == 0)
        frame_sad_thresh = frame_sad_thresh << 1;
      if (force_split[5 + blk64_scale_idx + lvl1_idx] == PART_EVAL_ALL) {
        get_variance(&vt->split[blk64_idx].split[lvl1_idx].part_variances.none);
        var_32x32 =
            vt->split[blk64_idx].split[lvl1_idx].part_variances.none.variance;
        max_var_32x32[blk64_idx] = AOMMAX(var_32x32, max_var_32x32[blk64_idx]);
        min_var_32x32[blk64_idx] = AOMMIN(var_32x32, min_var_32x32[blk64_idx]);
        const int max_min_var_16X16_diff = (maxvar_16x16[blk64_idx][lvl1_idx] -
                                            minvar_16x16[blk64_idx][lvl1_idx]);

        if (var_32x32 > thresholds[2] ||
            (!is_key_frame && var_32x32 > (thresholds[2] >> 1) &&
             var_32x32 > (avg_16x16[blk64_idx][lvl1_idx] >> 1))) {
          force_split[5 + blk64_scale_idx + lvl1_idx] = PART_EVAL_ONLY_SPLIT;
          force_split[blk64_idx + 1] = PART_EVAL_ONLY_SPLIT;
          force_split[0] = PART_EVAL_ONLY_SPLIT;
        } else if (!is_key_frame && is_360p_or_smaller &&
                   ((max_min_var_16X16_diff > (thresholds[2] >> 1) &&
                     maxvar_16x16[blk64_idx][lvl1_idx] > thresholds[2]) ||
                    (cpi->sf.rt_sf.prefer_large_partition_blocks &&
                     x->content_state_sb.source_sad_nonrd > kLowSad &&
                     cpi->rc.frame_source_sad < frame_sad_thresh &&
                     maxvar_16x16[blk64_idx][lvl1_idx] > (thresholds[2] >> 4) &&
                     maxvar_16x16[blk64_idx][lvl1_idx] >
                         (minvar_16x16[blk64_idx][lvl1_idx] << 2)))) {
          force_split[5 + blk64_scale_idx + lvl1_idx] = PART_EVAL_ONLY_SPLIT;
          force_split[blk64_idx + 1] = PART_EVAL_ONLY_SPLIT;
          force_split[0] = PART_EVAL_ONLY_SPLIT;
        }
      }
    }
    if (force_split[1 + blk64_idx] == PART_EVAL_ALL) {
      fill_variance_tree(&vt->split[blk64_idx], BLOCK_64X64);
      get_variance(&vt->split[blk64_idx].part_variances.none);
      var_64x64 = vt->split[blk64_idx].part_variances.none.variance;
      max_var_64x64 = AOMMAX(var_64x64, max_var_64x64);
      min_var_64x64 = AOMMIN(var_64x64, min_var_64x64);
      // If the difference of the max-min variances of sub-blocks or max
      // variance of a sub-block is above some threshold of then force this
      // block to split. Only checking this for noise level >= medium, if
      // encoder is in SVC or if we already forced large blocks.
      const int max_min_var_32x32_diff =
          max_var_32x32[blk64_idx] - min_var_32x32[blk64_idx];
      const int check_max_var = max_var_32x32[blk64_idx] > thresholds[1] >> 1;
      const bool check_noise_lvl = noise_level >= kMedium ||
                                   cpi->ppi->use_svc ||
                                   cpi->sf.rt_sf.prefer_large_partition_blocks;
      const int64_t set_threshold = 3 * (thresholds[1] >> 3);

      if (!is_key_frame && max_min_var_32x32_diff > set_threshold &&
          check_max_var && check_noise_lvl) {
        force_split[1 + blk64_idx] = PART_EVAL_ONLY_SPLIT;
        force_split[0] = PART_EVAL_ONLY_SPLIT;
      }
      avg_64x64 += var_64x64;
    }
    if (is_small_sb) force_split[0] = PART_EVAL_ONLY_SPLIT;
  }

  if (force_split[0] == PART_EVAL_ALL) {
    fill_variance_tree(vt, BLOCK_128X128);
    get_variance(&vt->part_variances.none);
    const int set_avg_64x64 = (9 * avg_64x64) >> 5;
    if (!is_key_frame && vt->part_variances.none.variance > set_avg_64x64)
      force_split[0] = PART_EVAL_ONLY_SPLIT;

    if (!is_key_frame &&
        (max_var_64x64 - min_var_64x64) > 3 * (thresholds[0] >> 3) &&
        max_var_64x64 > thresholds[0] >> 1)
      force_split[0] = PART_EVAL_ONLY_SPLIT;
  }

  if (mi_col + 32 > tile->mi_col_end || mi_row + 32 > tile->mi_row_end ||
      !set_vt_partitioning(cpi, xd, tile, vt, BLOCK_128X128, mi_row, mi_col,
                           thresholds[0], BLOCK_16X16, force_split[0])) {
    for (int blk64_idx = 0; blk64_idx < num_64x64_blocks; ++blk64_idx) {
      const int x64_idx = GET_BLK_IDX_X(blk64_idx, 4);
      const int y64_idx = GET_BLK_IDX_Y(blk64_idx, 4);
      const int blk64_scale_idx = blk64_idx << 2;

      // Now go through the entire structure, splitting every block size until
      // we get to one that's got a variance lower than our threshold.
      if (set_vt_partitioning(cpi, xd, tile, &vt->split[blk64_idx], BLOCK_64X64,
                              mi_row + y64_idx, mi_col + x64_idx, thresholds[1],
                              BLOCK_16X16, force_split[1 + blk64_idx]))
        continue;
      for (int lvl1_idx = 0; lvl1_idx < 4; ++lvl1_idx) {
        const int x32_idx = GET_BLK_IDX_X(lvl1_idx, 3);
        const int y32_idx = GET_BLK_IDX_Y(lvl1_idx, 3);
        const int lvl1_scale_idx = (blk64_scale_idx + lvl1_idx) << 2;
        if (set_vt_partitioning(
                cpi, xd, tile, &vt->split[blk64_idx].split[lvl1_idx],
                BLOCK_32X32, (mi_row + y64_idx + y32_idx),
                (mi_col + x64_idx + x32_idx), thresholds[2], BLOCK_16X16,
                force_split[5 + blk64_scale_idx + lvl1_idx]))
          continue;
        for (int lvl2_idx = 0; lvl2_idx < 4; ++lvl2_idx) {
          const int x16_idx = GET_BLK_IDX_X(lvl2_idx, 2);
          const int y16_idx = GET_BLK_IDX_Y(lvl2_idx, 2);
          const int split_index = 21 + lvl1_scale_idx + lvl2_idx;
          VP16x16 *vtemp =
              &vt->split[blk64_idx].split[lvl1_idx].split[lvl2_idx];
          if (set_vt_partitioning(cpi, xd, tile, vtemp, BLOCK_16X16,
                                  mi_row + y64_idx + y32_idx + y16_idx,
                                  mi_col + x64_idx + x32_idx + x16_idx,
                                  thresholds[3], BLOCK_8X8,
                                  force_split[split_index]))
            continue;
          for (int lvl3_idx = 0; lvl3_idx < 4; ++lvl3_idx) {
            const int x8_idx = GET_BLK_IDX_X(lvl3_idx, 1);
            const int y8_idx = GET_BLK_IDX_Y(lvl3_idx, 1);
            set_block_size(cpi, (mi_row + y64_idx + y32_idx + y16_idx + y8_idx),
                           (mi_col + x64_idx + x32_idx + x16_idx + x8_idx),
                           BLOCK_8X8);
          }
        }
      }
    }
  }

  if (cpi->sf.rt_sf.short_circuit_low_temp_var) {
    set_low_temp_var_flag(cpi, &x->part_search_info, xd, vt, thresholds,
                          ref_frame_partition, mi_col, mi_row, is_small_sb);
  }

  aom_free(vt);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, choose_var_based_partitioning_time);
#endif
  return 0;
}